

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

ParseNodeProg * __thiscall
Js::ScriptContext::ParseScript
          (ScriptContext *this,Parser *parser,byte *script,size_t cb,SRCINFO *pSrcInfo,
          CompileScriptException *pse,Utf8SourceInfo **ppSourceInfo,char16 *rootDisplayName,
          LoadScriptFlag loadScriptFlag,uint *sourceIndex,Var scriptSource)

{
  Utf8SourceInfo *pUVar1;
  byte *this_00;
  charcount_t cVar2;
  uint uVar3;
  Cache *pCVar4;
  SRCINFO **ppSVar5;
  SourceContextInfo **ppSVar6;
  LPCUTF8 pSrc;
  size_t length;
  ScriptContext *local_60;
  ParseNodeProg *parseTree;
  SourceContextInfo *pSStack_50;
  ULONG grfscr;
  SourceContextInfo *sourceContextInfo;
  CompileScriptException *pCStack_40;
  HRESULT hr;
  CompileScriptException *pse_local;
  SRCINFO *pSrcInfo_local;
  size_t cb_local;
  byte *script_local;
  Parser *parser_local;
  ScriptContext *this_local;
  
  pCStack_40 = pse;
  pse_local = (CompileScriptException *)pSrcInfo;
  pSrcInfo_local = (SRCINFO *)cb;
  cb_local = (size_t)script;
  script_local = (byte *)parser;
  parser_local = (Parser *)this;
  if (pSrcInfo == (SRCINFO *)0x0) {
    pCVar4 = Cache(this);
    ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_SRCINFO__
                        ((WriteBarrierPtr *)&pCVar4->noContextGlobalSourceInfo);
    pse_local = (CompileScriptException *)*ppSVar5;
  }
  MakeUtf8SourceInfo(this,(byte *)cb_local,(size_t)pSrcInfo_local,(SRCINFO *)pse_local,ppSourceInfo,
                     loadScriptFlag,scriptSource);
  ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SourceContextInfo__
                      ((WriteBarrierPtr *)pse_local);
  pSStack_50 = *ppSVar6;
  parseTree._4_4_ = GetParseFlags(this,loadScriptFlag,*ppSourceInfo,pSStack_50);
  this_00 = script_local;
  if ((loadScriptFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_Utf8Source) {
    sourceContextInfo._4_4_ =
         Parser::ParseUtf8Source
                   ((Parser *)script_local,(ParseNodeProg **)&local_60,(LPCUTF8)cb_local,
                    (size_t)pSrcInfo_local,parseTree._4_4_,pCStack_40,
                    &pSStack_50->nextLocalFunctionId,pSStack_50);
  }
  else {
    pSrc = Utf8SourceInfo::GetSource(*ppSourceInfo,(char16 *)0x0);
    length = Utf8SourceInfo::GetCbLength(*ppSourceInfo,(char16 *)0x0);
    sourceContextInfo._4_4_ =
         Parser::ParseCesu8Source
                   ((Parser *)this_00,(ParseNodeProg **)&local_60,pSrc,length,parseTree._4_4_,
                    pCStack_40,&pSStack_50->nextLocalFunctionId,pSStack_50);
  }
  if ((sourceContextInfo._4_4_ < 0) || (local_60 == (ScriptContext *)0x0)) {
    this_local = (ScriptContext *)0x0;
  }
  else {
    Utf8SourceInfo::SetParseFlags(*ppSourceInfo,parseTree._4_4_);
    if ((loadScriptFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_Utf8Source) {
      pUVar1 = *ppSourceInfo;
      cVar2 = Parser::GetSourceIchLim((Parser *)script_local);
      Utf8SourceInfo::SetCchLength(pUVar1,cVar2);
      pUVar1 = *ppSourceInfo;
      cVar2 = Parser::GetSourceIchLim((Parser *)script_local);
      uVar3 = SaveSourceNoCopy(this,pUVar1,cVar2,false);
      *sourceIndex = uVar3;
    }
    else {
      pUVar1 = *ppSourceInfo;
      cVar2 = Utf8SourceInfo::GetCchLength(*ppSourceInfo);
      uVar3 = SaveSourceNoCopy(this,pUVar1,cVar2,true);
      *sourceIndex = uVar3;
    }
    this_local = local_60;
  }
  return (ParseNodeProg *)this_local;
}

Assistant:

ParseNodeProg * ScriptContext::ParseScript(Parser* parser,
        const byte* script,
        size_t cb,
        SRCINFO const * pSrcInfo,
        CompileScriptException * pse,
        Utf8SourceInfo** ppSourceInfo,
        const char16 *rootDisplayName,
        LoadScriptFlag loadScriptFlag,
        uint* sourceIndex,
        Js::Var scriptSource)
    {
        if (pSrcInfo == nullptr)
        {
            pSrcInfo = this->Cache()->noContextGlobalSourceInfo;
        }

        MakeUtf8SourceInfo(script, cb, pSrcInfo, ppSourceInfo, loadScriptFlag, scriptSource);

        //
        // Parse and the JavaScript code
        //
        HRESULT hr;
        SourceContextInfo * sourceContextInfo = pSrcInfo->sourceContextInfo;

        // Invoke the parser, passing in the global function name, which we will then run to execute
        // the script.
        ULONG grfscr = GetParseFlags(loadScriptFlag, *ppSourceInfo, sourceContextInfo);

        ParseNodeProg * parseTree;
        if((loadScriptFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_Utf8Source)
        {
            hr = parser->ParseUtf8Source(&parseTree, script, cb, grfscr, pse,
                &sourceContextInfo->nextLocalFunctionId, sourceContextInfo);
        }
        else
        {
            hr = parser->ParseCesu8Source(&parseTree, (*ppSourceInfo)->GetSource(), (*ppSourceInfo)->GetCbLength(), grfscr,
                pse, &sourceContextInfo->nextLocalFunctionId, sourceContextInfo);
        }

        if(FAILED(hr) || parseTree == nullptr)
        {
            return nullptr;
        }

        (*ppSourceInfo)->SetParseFlags(grfscr);

        //Make sure we have the body and text information available
        if ((loadScriptFlag & LoadScriptFlag_Utf8Source) != LoadScriptFlag_Utf8Source)
        {
            *sourceIndex = this->SaveSourceNoCopy(*ppSourceInfo, static_cast<charcount_t>((*ppSourceInfo)->GetCchLength()), /*isCesu8*/ true);
        }
        else
        {
            // Update the length.
            (*ppSourceInfo)->SetCchLength(parser->GetSourceIchLim());
            *sourceIndex = this->SaveSourceNoCopy(*ppSourceInfo, parser->GetSourceIchLim(), /* isCesu8*/ false);
        }

        return parseTree;
    }